

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_1ab374::fillPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int width,int height)

{
  int in_EDX;
  int in_ESI;
  Array2D<Imath_3_2::half> *in_RDI;
  float fVar1;
  Array2D<Imath_3_2::half> *unaff_retaddr;
  int x;
  int y;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_18;
  undefined4 local_14;
  
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase(unaff_retaddr,(long)in_RDI,CONCAT44(in_ESI,in_EDX))
  ;
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      fVar1 = (float)((local_14 * in_ESI + local_18) % 0x801);
      Imf_3_2::Array2D<Imath_3_2::half>::operator[](in_RDI,(long)local_14);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(fVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<T>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}